

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddTweak
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,TweakMethod tweak)

{
  string *file;
  ostream *poVar1;
  cmScriptGeneratorIndent indent_00;
  cmInstallTargetGenerator *this_00;
  pointer file_00;
  pointer in_stack_00000008;
  size_type in_stack_00000010;
  string tws;
  ostringstream tw;
  allocator local_211;
  ulong local_210;
  string local_208;
  pointer local_1e8;
  size_type local_1e0;
  cmInstallTargetGenerator *local_1d8;
  string *local_1d0;
  string local_1c8;
  ostream local_1a8;
  
  local_210 = (ulong)(uint)indent.Level;
  file = (files->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)file == 0x20) {
    GetDestDirPath((string *)&local_1a8,(cmInstallTargetGenerator *)os,file);
    AddTweak(this,os,indent,config,(string *)&local_1a8,tweak);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  else {
    local_1e8 = in_stack_00000008;
    local_1e0 = in_stack_00000010;
    local_1d8 = this;
    local_1d0 = config;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__cxx11::string::string((string *)&local_208,"${file}",&local_211);
    local_1c8._M_dataplus._M_p = local_1e8;
    local_1c8._M_string_length = local_1e0;
    AddTweak(local_1d8,&local_1a8,(Indent)((int)local_210 + 2),local_1d0,&local_208,tweak);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringbuf::str();
    if (local_208._M_string_length != 0) {
      poVar1 = operator<<(os,(cmScriptGeneratorIndent)(int)local_210);
      std::operator<<(poVar1,"foreach(file\n");
      indent_00.Level = (int)local_210 + 4;
      for (file_00 = (files->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          file_00 !=
          (files->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish; file_00 = file_00 + 1) {
        poVar1 = operator<<(os,indent_00);
        this_00 = (cmInstallTargetGenerator *)0x51a873;
        poVar1 = std::operator<<(poVar1,"\"");
        GetDestDirPath(&local_1c8,this_00,file_00);
        poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
        std::operator<<(poVar1,"\"\n");
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      poVar1 = operator<<(os,indent_00);
      std::operator<<(poVar1,")\n");
      std::operator<<(os,(string *)&local_208);
      poVar1 = operator<<(os,(cmScriptGeneratorIndent)(int)local_210);
      std::operator<<(poVar1,"endforeach()\n");
    }
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddTweak(std::ostream& os, Indent indent,
                                        const std::string& config,
                                        std::vector<std::string> const& files,
                                        TweakMethod tweak)
{
  if (files.size() == 1) {
    // Tweak a single file.
    this->AddTweak(os, indent, config, this->GetDestDirPath(files[0]), tweak);
  } else {
    // Generate a foreach loop to tweak multiple files.
    std::ostringstream tw;
    this->AddTweak(tw, indent.Next(), config, "${file}", tweak);
    std::string tws = tw.str();
    if (!tws.empty()) {
      Indent indent2 = indent.Next().Next();
      os << indent << "foreach(file\n";
      for (std::vector<std::string>::const_iterator i = files.begin();
           i != files.end(); ++i) {
        os << indent2 << "\"" << this->GetDestDirPath(*i) << "\"\n";
      }
      os << indent2 << ")\n";
      os << tws;
      os << indent << "endforeach()\n";
    }
  }
}